

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsa_Initialize(PaUtilHostApiRepresentation **hostApi,PaHostApiIndex hostApiIndex)

{
  int iVar1;
  PaUint32 PVar2;
  PaAlsaHostApiRepresentation *alsaApi;
  PaUtilAllocationGroup *pPVar3;
  PaAlsaHostApiRepresentation *alsaHostApi;
  PaError result;
  PaHostApiIndex hostApiIndex_local;
  PaUtilHostApiRepresentation **hostApi_local;
  
  iVar1 = PaAlsa_LoadLibrary();
  if (iVar1 == 0) {
    hostApi_local._4_4_ = -0x26fb;
  }
  else {
    alsaApi = (PaAlsaHostApiRepresentation *)PaUtil_AllocateMemory(0x118);
    if (alsaApi == (PaAlsaHostApiRepresentation *)0x0) {
      PaUtil_DebugPrint(
                       "Expression \'alsaHostApi = (PaAlsaHostApiRepresentation*) PaUtil_AllocateMemory( sizeof(PaAlsaHostApiRepresentation) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 747\n"
                       );
      alsaHostApi._0_4_ = -0x2708;
    }
    else {
      pPVar3 = PaUtil_CreateAllocationGroup();
      alsaApi->allocations = pPVar3;
      if (pPVar3 == (PaUtilAllocationGroup *)0x0) {
        PaUtil_DebugPrint(
                         "Expression \'alsaHostApi->allocations = PaUtil_CreateAllocationGroup()\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 748\n"
                         );
        alsaHostApi._0_4_ = -0x2708;
      }
      else {
        alsaApi->hostApiIndex = hostApiIndex;
        PVar2 = PaAlsaVersionNum();
        alsaApi->alsaLibVersion = PVar2;
        *hostApi = (PaUtilHostApiRepresentation *)alsaApi;
        ((*hostApi)->info).structVersion = 1;
        ((*hostApi)->info).type = paALSA;
        ((*hostApi)->info).name = "ALSA";
        (*hostApi)->Terminate = Terminate;
        (*hostApi)->OpenStream = OpenStream;
        (*hostApi)->IsFormatSupported = IsFormatSupported;
        paUtilErr_ = BuildDeviceList(alsaApi);
        if (paUtilErr_ < 0) {
          PaUtil_DebugPrint(
                           "Expression \'BuildDeviceList( alsaHostApi )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 766\n"
                           );
          alsaHostApi._0_4_ = paUtilErr_;
        }
        else {
          PaUtil_InitializeStreamInterface
                    (&alsaApi->callbackStreamInterface,CloseStream,StartStream,StopStream,
                     AbortStream,IsStreamStopped,IsStreamActive,GetStreamTime,GetStreamCpuLoad,
                     PaUtil_DummyRead,PaUtil_DummyWrite,PaUtil_DummyGetReadAvailable,
                     PaUtil_DummyGetWriteAvailable);
          PaUtil_InitializeStreamInterface
                    (&alsaApi->blockingStreamInterface,CloseStream,StartStream,StopStream,
                     AbortStream,IsStreamStopped,IsStreamActive,GetStreamTime,PaUtil_DummyGetCpuLoad
                     ,ReadStream,WriteStream,GetStreamReadAvailable,GetStreamWriteAvailable);
          paUtilErr_ = PaUnixThreading_Initialize();
          if (-1 < paUtilErr_) {
            return 0;
          }
          PaUtil_DebugPrint(
                           "Expression \'PaUnixThreading_Initialize()\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c\', line: 786\n"
                           );
          alsaHostApi._0_4_ = paUtilErr_;
        }
      }
    }
    if (alsaApi != (PaAlsaHostApiRepresentation *)0x0) {
      if (alsaApi->allocations != (PaUtilAllocationGroup *)0x0) {
        PaUtil_FreeAllAllocations(alsaApi->allocations);
        PaUtil_DestroyAllocationGroup(alsaApi->allocations);
      }
      PaUtil_FreeMemory(alsaApi);
    }
    hostApi_local._4_4_ = (PaError)alsaHostApi;
  }
  return hostApi_local._4_4_;
}

Assistant:

PaError PaAlsa_Initialize( PaUtilHostApiRepresentation **hostApi, PaHostApiIndex hostApiIndex )
{
    PaError result = paNoError;
    PaAlsaHostApiRepresentation *alsaHostApi = NULL;

    /* Try loading Alsa library. */
    if (!PaAlsa_LoadLibrary())
        return paHostApiNotFound;

    PA_UNLESS( alsaHostApi = (PaAlsaHostApiRepresentation*) PaUtil_AllocateMemory(
                sizeof(PaAlsaHostApiRepresentation) ), paInsufficientMemory );
    PA_UNLESS( alsaHostApi->allocations = PaUtil_CreateAllocationGroup(), paInsufficientMemory );
    alsaHostApi->hostApiIndex = hostApiIndex;
    alsaHostApi->alsaLibVersion = PaAlsaVersionNum();

    *hostApi = (PaUtilHostApiRepresentation*)alsaHostApi;
    (*hostApi)->info.structVersion = 1;
    (*hostApi)->info.type = paALSA;
    (*hostApi)->info.name = "ALSA";

    (*hostApi)->Terminate = Terminate;
    (*hostApi)->OpenStream = OpenStream;
    (*hostApi)->IsFormatSupported = IsFormatSupported;

    /** If AlsaErrorHandler is to be used, do not forget to unregister callback pointer in
        Terminate function.
    */
    /*ENSURE_( snd_lib_error_set_handler(AlsaErrorHandler), paUnanticipatedHostError );*/

    PA_ENSURE( BuildDeviceList( alsaHostApi ) );

    PaUtil_InitializeStreamInterface( &alsaHostApi->callbackStreamInterface,
                                      CloseStream, StartStream,
                                      StopStream, AbortStream,
                                      IsStreamStopped, IsStreamActive,
                                      GetStreamTime, GetStreamCpuLoad,
                                      PaUtil_DummyRead, PaUtil_DummyWrite,
                                      PaUtil_DummyGetReadAvailable,
                                      PaUtil_DummyGetWriteAvailable );

    PaUtil_InitializeStreamInterface( &alsaHostApi->blockingStreamInterface,
                                      CloseStream, StartStream,
                                      StopStream, AbortStream,
                                      IsStreamStopped, IsStreamActive,
                                      GetStreamTime, PaUtil_DummyGetCpuLoad,
                                      ReadStream, WriteStream,
                                      GetStreamReadAvailable,
                                      GetStreamWriteAvailable );

    PA_ENSURE( PaUnixThreading_Initialize() );

    return result;

error:
    if( alsaHostApi )
    {
        if( alsaHostApi->allocations )
        {
            PaUtil_FreeAllAllocations( alsaHostApi->allocations );
            PaUtil_DestroyAllocationGroup( alsaHostApi->allocations );
        }

        PaUtil_FreeMemory( alsaHostApi );
    }

    return result;
}